

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  int *piVar1;
  ImGuiTabItem *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiID IVar5;
  ImGuiShrinkWidthItem *pIVar6;
  char *__src;
  ImVec2 IVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  ImGuiID IVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  undefined4 uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int section_n;
  long lVar21;
  ImGuiTabItem *pIVar22;
  ImGuiShrinkWidthItem *__dest;
  ulong uVar23;
  char *__dest_00;
  int iVar24;
  code *in_RCX;
  ImGuiTabBar *pIVar25;
  ImGuiTabBar *pIVar26;
  ImGuiTabItem *pIVar27;
  int iVar28;
  ImGuiWindow *pIVar29;
  long lVar30;
  ImGuiTabItem *pIVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  ImGuiTabBar *pIVar36;
  float *pfVar37;
  long lVar38;
  ImGuiID IVar39;
  ImGuiID *pIVar40;
  size_t size;
  uint uVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  undefined8 local_f0;
  float local_e8 [3];
  int iStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  int local_94 [2];
  float local_8c;
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  ImVec4 local_78;
  undefined8 local_68;
  ImVec2 local_60;
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  pIVar16 = GImGui;
  tab_bar->WantLayout = false;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  stack0xffffffffffffff20 = 0;
  local_c8 = 0.0;
  iVar33 = (tab_bar->Tabs).Size;
  if (iVar33 < 1) {
    bVar18 = false;
    iVar24 = 0;
  }
  else {
    lVar21 = 0;
    in_RCX = (code *)0x0;
    uVar35 = 0;
    uVar23 = 0;
    bVar18 = false;
    do {
      pIVar31 = (tab_bar->Tabs).Data;
      pIVar40 = (ImGuiID *)((long)&pIVar31->ID + lVar21);
      if ((*(int *)((long)&pIVar31->LastFrameVisible + lVar21) < tab_bar->PrevFrameVisible) ||
         ((&pIVar31->WantClose)[lVar21] == true)) {
        IVar39 = *pIVar40;
        if (tab_bar->VisibleTabId == IVar39) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == IVar39) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == IVar39) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        iVar33 = (int)uVar23;
        if (uVar35 != uVar23) {
          *(undefined4 *)((long)&pIVar31[iVar33].BeginOrder + 1) =
               *(undefined4 *)((long)pIVar40 + 0x1f);
          IVar39 = *pIVar40;
          IVar5 = pIVar40[1];
          IVar8 = pIVar40[2];
          IVar9 = pIVar40[3];
          fVar45 = (float)pIVar40[5];
          fVar42 = (float)pIVar40[6];
          IVar10 = pIVar40[7];
          pfVar37 = &pIVar31[iVar33].Offset;
          *pfVar37 = (float)pIVar40[4];
          pfVar37[1] = fVar45;
          pfVar37[2] = fVar42;
          pfVar37[3] = (float)IVar10;
          pIVar31 = pIVar31 + iVar33;
          pIVar31->ID = IVar39;
          pIVar31->Flags = IVar5;
          pIVar31->LastFrameVisible = IVar8;
          pIVar31->LastFrameSelected = IVar9;
        }
        pIVar31 = (tab_bar->Tabs).Data;
        pIVar31[iVar33].IndexDuringLayout = (ImS16)uVar23;
        uVar41 = pIVar31[iVar33].Flags;
        lVar30 = 0;
        if ((uVar41 & 0x40) == 0) {
          lVar30 = (ulong)((char)uVar41 < '\0') + 1;
        }
        if (0 < iVar33) {
          bVar19 = bVar18;
          if ((pIVar31[uVar23 - 1].Flags & 0x40U) == 0) {
            bVar19 = true;
          }
          if ((uVar41 & 0x40) == 0) {
            bVar19 = bVar18;
          }
          bVar18 = bVar19;
          if ((pIVar31[uVar23 - 1].Flags & 0xc0U) == 0x80) {
            bVar18 = true;
          }
          if ((uVar41 & 0xc0) == 0x80) {
            bVar18 = bVar19;
          }
        }
        local_e8[lVar30 * 3] = (float)((int)local_e8[lVar30 * 3] + 1);
        uVar23 = (ulong)(iVar33 + 1);
      }
      iVar24 = (int)uVar23;
      uVar35 = uVar35 + 1;
      iVar33 = (tab_bar->Tabs).Size;
      lVar21 = lVar21 + 0x24;
    } while ((long)uVar35 < (long)iVar33);
  }
  if (iVar33 != iVar24) {
    iVar33 = (tab_bar->Tabs).Capacity;
    if (iVar33 < iVar24) {
      if (iVar33 == 0) {
        iVar28 = 8;
      }
      else {
        iVar28 = iVar33 / 2 + iVar33;
      }
      if (iVar28 <= iVar24) {
        iVar28 = iVar24;
      }
      if (iVar33 < iVar28) {
        pIVar22 = (ImGuiTabItem *)MemAlloc((long)iVar28 * 0x24);
        pIVar31 = (tab_bar->Tabs).Data;
        if (pIVar31 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar22,pIVar31,(long)(tab_bar->Tabs).Size * 0x24);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar22;
        (tab_bar->Tabs).Capacity = iVar28;
      }
    }
    (tab_bar->Tabs).Size = iVar24;
  }
  if (bVar18) {
    in_RCX = TabItemComparerBySection;
    qsort((tab_bar->Tabs).Data,(long)(tab_bar->Tabs).Size,0x24,TabItemComparerBySection);
  }
  fVar43 = local_e8[0];
  fVar42 = 0.0;
  fVar45 = 0.0;
  iVar33 = (int)uStack_d0;
  if ((0 < (int)local_e8[0]) &&
     ((int)uStack_d0 + iStack_dc != 0 &&
      SCARRY4((int)uStack_d0,iStack_dc) == (int)uStack_d0 + iStack_dc < 0)) {
    fVar45 = (pIVar16->Style).ItemInnerSpacing.x;
  }
  stack0xffffffffffffff20 = CONCAT44(iStack_dc,fVar45);
  pIVar25 = (ImGuiTabBar *)CONCAT71((int7)((ulong)in_RCX >> 8),0 < (int)uStack_d0 && 0 < iStack_dc);
  if (0 < (int)uStack_d0 && 0 < iStack_dc) {
    fVar42 = (pIVar16->Style).ItemInnerSpacing.x;
  }
  local_d8 = CONCAT44(fVar42,(float)local_d8);
  IVar39 = tab_bar->NextSelectedTabId;
  if (IVar39 == 0) {
    IVar39 = 0;
  }
  else {
    tab_bar->SelectedTabId = IVar39;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar18 = TabBarProcessReorder(tab_bar);
    if ((bVar18) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      IVar39 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar15 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    local_f0 = (ImGuiID *)CONCAT44(local_f0._4_4_,IVar39);
    pIVar29 = GImGui->CurrentWindow;
    fVar45 = (GImGui->Style).FramePadding.y;
    fVar42 = GImGui->FontSize;
    local_b8._0_4_ = (pIVar29->DC).CursorPos.x;
    local_b8._4_4_ = (pIVar29->DC).CursorPos.y;
    fVar52 = (tab_bar->BarRect).Min.y;
    pIVar25 = (ImGuiTabBar *)(ulong)(uint)fVar52;
    (pIVar29->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar45;
    (pIVar29->DC).CursorPos.y = fVar52;
    (tab_bar->BarRect).Min.x = fVar42 + fVar45 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar15->Style).Colors[0].x;
    local_58.y = (pIVar15->Style).Colors[0].y;
    uVar11 = (pIVar15->Style).Colors[0].z;
    uVar12 = (pIVar15->Style).Colors[0].w;
    local_58.w = (float)uVar12 * 0.5;
    local_58.z = (float)uVar11;
    pIVar40 = (ImGuiID *)0x0;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    bVar18 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar18) {
      local_a8._0_8_ = pIVar29;
      if ((tab_bar->Tabs).Size < 1) {
        pIVar40 = (ImGuiID *)0x0;
      }
      else {
        lVar21 = 0;
        lVar30 = 0;
        pIVar40 = (ImGuiID *)0x0;
        do {
          pIVar31 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar31->Flags + lVar21 + 2) & 0x20) == 0) {
            local_78.x = 0.0;
            local_78.y = 0.0;
            bVar18 = Selectable((tab_bar->TabsNames).Buf.Data +
                                *(short *)((long)&pIVar31->NameOffset + lVar21),
                                tab_bar->SelectedTabId == *(ImGuiID *)((long)&pIVar31->ID + lVar21),
                                0,(ImVec2 *)&local_78);
            if (bVar18) {
              pIVar40 = (ImGuiID *)((long)&pIVar31->ID + lVar21);
            }
          }
          lVar30 = lVar30 + 1;
          lVar21 = lVar21 + 0x24;
        } while (lVar30 < (tab_bar->Tabs).Size);
      }
      pIVar25 = tab_bar;
      EndPopup();
      pIVar29 = (ImGuiWindow *)local_a8._0_8_;
    }
    auVar49 = local_b8;
    (pIVar29->DC).CursorPos.x = (float)local_b8._0_4_;
    (pIVar29->DC).CursorPos.y = (float)local_b8._4_4_;
    IVar39 = (ImGuiID)(float)local_f0;
    local_b8 = auVar49;
    if (pIVar40 != (ImGuiID *)0x0) {
      IVar39 = *pIVar40;
      tab_bar->SelectedTabId = IVar39;
    }
  }
  local_94[0] = 0;
  local_94[1] = iVar33 + (int)fVar43;
  local_8c = fVar43;
  iVar33 = (tab_bar->Tabs).Size;
  iVar24 = (pIVar16->ShrinkWidthBuffer).Capacity;
  if (iVar24 < iVar33) {
    if (iVar24 == 0) {
      iVar28 = 8;
    }
    else {
      iVar28 = iVar24 / 2 + iVar24;
    }
    if (iVar28 <= iVar33) {
      iVar28 = iVar33;
    }
    if (iVar24 < iVar28) {
      __dest = (ImGuiShrinkWidthItem *)MemAlloc((long)iVar28 << 3);
      pIVar6 = (pIVar16->ShrinkWidthBuffer).Data;
      if (pIVar6 != (ImGuiShrinkWidthItem *)0x0) {
        memcpy(__dest,pIVar6,(long)(pIVar16->ShrinkWidthBuffer).Size << 3);
        MemFree((pIVar16->ShrinkWidthBuffer).Data);
      }
      (pIVar16->ShrinkWidthBuffer).Data = __dest;
      (pIVar16->ShrinkWidthBuffer).Capacity = iVar28;
    }
  }
  (pIVar16->ShrinkWidthBuffer).Size = iVar33;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_b8._8_8_;
  local_b8 = auVar49 << 0x40;
  if ((tab_bar->Tabs).Size < 1) {
    bVar18 = true;
    pIVar40 = (ImGuiID *)0x0;
  }
  else {
    lVar21 = 0;
    lVar30 = 0;
    local_f0 = (ImGuiID *)0x0;
    bVar18 = false;
    iVar33 = -1;
    do {
      pIVar31 = (tab_bar->Tabs).Data;
      pIVar40 = (ImGuiID *)((long)&pIVar31->ID + lVar21);
      if (((local_f0 == (ImGuiID *)0x0) ||
          ((int)local_f0[3] < *(int *)((long)&pIVar31->LastFrameSelected + lVar21))) &&
         ((*(byte *)((long)&pIVar31->Flags + lVar21 + 2) & 0x20) == 0)) {
        local_f0 = pIVar40;
      }
      IVar5 = *pIVar40;
      if (IVar5 == tab_bar->SelectedTabId) {
        bVar18 = true;
      }
      if ((IVar39 == 0) && (IVar39 = IVar5, pIVar16->NavJustMovedToId != IVar5)) {
        IVar39 = 0;
      }
      IVar7 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data +
                              *(short *)((long)&pIVar31->NameOffset + lVar21),
                              (*(uint *)((long)&pIVar31->Flags + lVar21) >> 0x14 & 1) == 0);
      auVar49 = local_b8;
      fVar45 = IVar7.x;
      *(float *)((long)&pIVar31->ContentWidth + lVar21) = fVar45;
      uVar41 = *(uint *)((long)&pIVar31->Flags + lVar21);
      uVar23 = (ulong)(((char)uVar41 < '\0') + 1);
      if ((uVar41 & 0x40) != 0) {
        uVar23 = 0;
      }
      fVar42 = 0.0;
      if ((int)uVar23 == iVar33) {
        fVar42 = (pIVar16->Style).ItemInnerSpacing.x;
      }
      local_e8[uVar23 * 3 + 1] = fVar42 + fVar45 + local_e8[uVar23 * 3 + 1];
      iVar33 = local_94[uVar23];
      local_94[uVar23] = iVar33 + 1;
      pIVar6 = (pIVar16->ShrinkWidthBuffer).Data;
      pIVar6[iVar33].Index = (int)lVar30;
      pIVar6[iVar33].Width = fVar45;
      *(float *)((long)&pIVar31->Width + lVar21) = fVar45;
      lVar30 = lVar30 + 1;
      iVar24 = (tab_bar->Tabs).Size;
      pIVar25 = (ImGuiTabBar *)(long)iVar24;
      lVar21 = lVar21 + 0x24;
      iVar33 = (int)uVar23;
    } while (lVar30 < (long)pIVar25);
    local_b8._1_7_ = 0;
    local_b8[0] = 1 < iVar24;
    local_b8._8_8_ = auVar49._8_8_;
    bVar18 = !bVar18;
    pIVar40 = local_f0;
  }
  tab_bar->WidthAllTabsIdeal = 0.0;
  fVar45 = 0.0;
  lVar21 = 8;
  do {
    fVar45 = fVar45 + *(float *)((long)&local_f0 + lVar21 + 4) + *(float *)((long)local_e8 + lVar21)
    ;
    lVar21 = lVar21 + 0xc;
  } while (lVar21 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar45;
  pIVar15 = GImGui;
  if (((local_b8[0] & (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x < fVar45) != 0) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    local_f0 = (ImGuiID *)CONCAT44(local_f0._4_4_,IVar39);
    pIVar29 = GImGui->CurrentWindow;
    fVar42 = GImGui->FontSize + -2.0;
    local_a8 = ZEXT416((uint)fVar42);
    fVar45 = (GImGui->Style).FramePadding.y;
    _local_88 = ZEXT416((uint)(fVar45 + fVar45 + GImGui->FontSize));
    local_b8 = ZEXT416((uint)(fVar42 + fVar42));
    local_60 = (pIVar29->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar13 = (GImGui->Style).Colors[0].z;
    uVar14 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar14 * 0.5;
    local_58.z = (float)uVar13;
    pIVar31 = (ImGuiTabItem *)0x0;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    local_68._0_4_ = (pIVar15->IO).KeyRepeatDelay;
    local_68._4_4_ = (pIVar15->IO).KeyRepeatRate;
    (pIVar15->IO).KeyRepeatDelay = 0.25;
    (pIVar15->IO).KeyRepeatRate = 0.2;
    fVar45 = (tab_bar->BarRect).Min.x;
    fVar42 = (tab_bar->BarRect).Max.x - (float)local_b8._0_4_;
    uVar41 = -(uint)(fVar42 <= fVar45);
    fVar42 = (float)(uVar41 & (uint)fVar45 | ~uVar41 & (uint)fVar42);
    local_48 = ZEXT416((uint)fVar42);
    fVar45 = (tab_bar->BarRect).Min.y;
    (pIVar29->DC).CursorPos.x = fVar42;
    (pIVar29->DC).CursorPos.y = fVar45;
    uVar17 = local_88._0_4_;
    uStack_7c = local_88._4_4_;
    local_88._4_4_ = local_88._0_4_;
    local_88._0_4_ = local_a8._0_4_;
    uStack_80 = local_a8._4_4_;
    IVar7.y = (float)uVar17;
    IVar7.x = (float)local_a8._0_4_;
    bVar19 = ArrowButtonEx("##<",0,IVar7,0x410);
    fVar45 = (tab_bar->BarRect).Min.y;
    (pIVar29->DC).CursorPos.x = (float)local_48._0_4_ + (float)local_a8._0_4_;
    local_a8._0_8_ = pIVar29;
    (pIVar29->DC).CursorPos.y = fVar45;
    bVar20 = ArrowButtonEx("##>",1,(ImVec2)local_88,0x410);
    iVar33 = -(uint)bVar19;
    if (bVar20) {
      iVar33 = 1;
    }
    PopStyleColor(2);
    (pIVar15->IO).KeyRepeatDelay = (float)(undefined4)local_68;
    (pIVar15->IO).KeyRepeatRate = (float)local_68._4_4_;
    if (iVar33 != 0) {
      IVar39 = tab_bar->SelectedTabId;
      if (IVar39 == 0) {
LAB_00166c42:
        pIVar25 = (ImGuiTabBar *)0x0;
      }
      else {
        uVar23 = (ulong)(tab_bar->Tabs).Size;
        bVar19 = 0 < (long)uVar23;
        if (0 < (long)uVar23) {
          pIVar25 = (ImGuiTabBar *)(tab_bar->Tabs).Data;
          bVar19 = true;
          if ((pIVar25->Tabs).Size != IVar39) {
            pIVar36 = (ImGuiTabBar *)((long)pIVar25 + uVar23 * 0x24 + -0x24);
            pIVar26 = pIVar25;
            uVar35 = 0;
            do {
              uVar34 = uVar23;
              pIVar25 = pIVar36;
              if (uVar23 - 1 == uVar35) break;
              pIVar25 = (ImGuiTabBar *)&pIVar26->CurrFrameVisible;
              uVar34 = uVar35 + 1;
              piVar1 = &pIVar26->CurrFrameVisible;
              pIVar26 = pIVar25;
              uVar35 = uVar34;
            } while (*piVar1 != IVar39);
            bVar19 = uVar34 < uVar23;
          }
        }
        if (!bVar19) goto LAB_00166c42;
      }
      if (pIVar25 == (ImGuiTabBar *)0x0) {
        pIVar31 = (ImGuiTabItem *)0x0;
      }
      else {
        pIVar22 = (tab_bar->Tabs).Data;
        iVar24 = (int)((ulong)((long)pIVar25 - (long)pIVar22) >> 2) * 0x38e38e39;
        iVar28 = iVar33 + iVar24;
        do {
          if ((iVar28 < 0) || (iVar32 = iVar28, (tab_bar->Tabs).Size <= iVar28)) {
            iVar32 = iVar24;
          }
          pIVar31 = pIVar22 + iVar32;
          if ((pIVar31->Flags & 0x200000) != 0) {
            iVar24 = iVar24 + iVar33;
            iVar28 = iVar28 + iVar33;
            if ((-1 < iVar28) && (iVar28 < (tab_bar->Tabs).Size)) {
              pIVar31 = (ImGuiTabItem *)0x0;
            }
          }
        } while (pIVar31 == (ImGuiTabItem *)0x0);
      }
    }
    *(ImVec2 *)(local_a8._0_8_ + 0xd8) = local_60;
    (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - ((float)local_b8._0_4_ + 1.0);
    IVar39 = (ImGuiID)(float)local_f0;
    if ((pIVar31 != (ImGuiTabItem *)0x0) && (IVar39 = pIVar31->ID, (pIVar31->Flags & 0x200000) == 0)
       ) {
      tab_bar->SelectedTabId = IVar39;
    }
  }
  fVar45 = local_e8[1] + local_e8[2] + uStack_d0._4_4_ + local_c8;
  fVar42 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  if (fVar45 < fVar42) {
    fVar43 = ((float)local_d8 + local_d8._4_4_) -
             ((fVar42 - (local_e8[1] + local_e8[2])) - (uStack_d0._4_4_ + local_c8));
    fVar43 = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
  }
  else {
    fVar43 = fVar45 - fVar42;
  }
  fVar52 = local_d8._4_4_;
  fVar53 = local_e8[2];
  if ((0.0 < fVar43) && ((fVar42 <= fVar45 || ((tab_bar->Flags & 0x40U) != 0)))) {
    local_f0 = (ImGuiID *)CONCAT44(local_f0._4_4_,local_d8._4_4_);
    local_b8._0_4_ = local_e8[2];
    if (fVar42 <= fVar45) {
      iVar24 = 0;
      iVar33 = (int)uStack_d0 + (int)local_e8[0];
    }
    else {
      iVar33 = iStack_dc;
      iVar24 = (int)uStack_d0 + (int)local_e8[0];
    }
    lVar21 = (long)iVar24;
    ShrinkWidths((pIVar16->ShrinkWidthBuffer).Data + lVar21,iVar33,fVar43);
    fVar52 = (float)local_f0;
    fVar53 = (float)local_b8._0_4_;
    if (0 < iVar33) {
      pIVar6 = (pIVar16->ShrinkWidthBuffer).Data;
      do {
        iVar28 = (int)pIVar6[lVar21].Width;
        if (-1 < iVar28) {
          fVar45 = (float)iVar28;
          pIVar31 = (tab_bar->Tabs).Data;
          iVar28 = pIVar6[lVar21].Index;
          lVar30 = (ulong)((char)pIVar31[iVar28].Flags < '\0') + 1;
          if ((pIVar31[iVar28].Flags & 0x40U) != 0) {
            lVar30 = 0;
          }
          local_e8[lVar30 * 3 + 1] = local_e8[lVar30 * 3 + 1] - (pIVar31[iVar28].Width - fVar45);
          pIVar31[iVar28].Width = fVar45;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < iVar24 + iVar33);
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  lVar21 = 0;
  fVar42 = 0.0;
  iVar33 = 0;
  fVar45 = 0.0;
  do {
    fVar43 = fVar42;
    if ((lVar21 == 2) &&
       (fVar43 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_e8[7],
       fVar43 = (float)(~-(uint)(fVar43 <= 0.0) & (uint)fVar43), fVar42 <= fVar43)) {
      fVar43 = fVar42;
    }
    fVar46 = local_e8[lVar21 * 3];
    lVar30 = (long)(int)fVar46;
    if (0 < lVar30) {
      pfVar37 = &(tab_bar->Tabs).Data[iVar33].Width;
      lVar38 = 0;
      do {
        pfVar37[-1] = fVar43;
        fVar42 = 0.0;
        if (lVar38 < lVar30 + -1) {
          fVar42 = (pIVar16->Style).ItemInnerSpacing.x;
        }
        fVar43 = fVar43 + fVar42 + *pfVar37;
        lVar38 = lVar38 + 1;
        pfVar37 = pfVar37 + 9;
      } while (lVar30 != lVar38);
    }
    fVar42 = local_e8[lVar21 * 3 + 1] + local_e8[lVar21 * 3 + 2];
    fVar45 = fVar45 + (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
    fVar42 = fVar43 + local_e8[lVar21 * 3 + 2];
    iVar33 = (int)fVar46 + iVar33;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 3);
  tab_bar->WidthAllTabs = fVar45;
  if (bVar18) {
    tab_bar->SelectedTabId = 0;
  }
  if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
     (pIVar40 != (ImGuiID *)0x0)) {
    IVar39 = *pIVar40;
    tab_bar->SelectedTabId = IVar39;
  }
  pIVar31 = (ImGuiTabItem *)(ulong)tab_bar->SelectedTabId;
  tab_bar->VisibleTabId = tab_bar->SelectedTabId;
  tab_bar->VisibleTabWasSubmitted = false;
  if (IVar39 != 0) {
    uVar23 = (ulong)(tab_bar->Tabs).Size;
    bVar18 = 0 < (long)uVar23;
    if (0 < (long)uVar23) {
      pIVar31 = (tab_bar->Tabs).Data;
      bVar18 = true;
      if (pIVar31->ID != IVar39) {
        pIVar27 = pIVar31 + (uVar23 - 1);
        pIVar22 = pIVar31;
        uVar35 = 1;
        do {
          uVar34 = uVar35;
          pIVar31 = pIVar27;
          if (uVar23 == uVar34) break;
          pIVar31 = pIVar22 + 1;
          pIVar2 = pIVar22 + 1;
          pIVar22 = pIVar31;
          uVar35 = uVar34 + 1;
        } while (pIVar2->ID != IVar39);
        bVar18 = uVar34 < uVar23;
      }
    }
    if (((bVar18) && (pIVar31 != (ImGuiTabItem *)0x0)) && ((pIVar31->Flags & 0xc0) == 0)) {
      fVar45 = GImGui->FontSize;
      iVar33 = (int)((ulong)((long)pIVar31 - (long)(tab_bar->Tabs).Data) >> 2) * 0x38e38e39;
      fVar42 = (tab_bar->BarRect).Max.x;
      fVar43 = (tab_bar->BarRect).Min.x;
      fVar44 = pIVar31->Offset - local_e8[1];
      fVar46 = fVar45;
      if (iVar33 < (int)local_e8[0]) {
        fVar46 = -0.0;
      }
      fVar46 = fVar44 - fVar46;
      if ((tab_bar->Tabs).Size - (int)uStack_d0 <= iVar33 + 1) {
        fVar45 = 1.0;
      }
      fVar45 = fVar44 + pIVar31->Width + fVar45;
      tab_bar->ScrollingTargetDistToVisibility = 0.0;
      if ((fVar46 < tab_bar->ScrollingTarget) ||
         (fVar42 = (((fVar42 - fVar43) - local_e8[1]) - uStack_d0._4_4_) - fVar52,
         fVar42 <= fVar45 - fVar46)) {
        fVar43 = tab_bar->ScrollingAnim - fVar45;
      }
      else {
        if (fVar45 - fVar42 <= tab_bar->ScrollingTarget) goto LAB_0016709c;
        fVar43 = (fVar46 - fVar42) - tab_bar->ScrollingAnim;
        fVar46 = fVar45 - fVar42;
      }
      tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
      tab_bar->ScrollingTarget = fVar46;
    }
  }
LAB_0016709c:
  fVar45 = (tab_bar->BarRect).Min.x;
  fVar42 = (tab_bar->BarRect).Max.x;
  auVar47._0_4_ = tab_bar->WidthAllTabs - (fVar42 - fVar45);
  uVar3 = tab_bar->ScrollingAnim;
  uVar4 = tab_bar->ScrollingTarget;
  auVar48._4_4_ = uVar4;
  auVar48._0_4_ = uVar3;
  auVar48._8_8_ = 0;
  auVar47._4_4_ = auVar47._0_4_;
  auVar47._8_4_ = auVar47._0_4_;
  auVar47._12_4_ = auVar47._0_4_;
  auVar49 = minps(auVar48,auVar47);
  fVar43 = (float)(-(uint)(0.0 <= auVar49._0_4_) & (uint)auVar49._0_4_);
  fVar46 = (float)(-(uint)(0.0 <= auVar49._4_4_) & (uint)auVar49._4_4_);
  tab_bar->ScrollingAnim = fVar43;
  tab_bar->ScrollingTarget = fVar46;
  if ((fVar43 != fVar46) || (NAN(fVar43) || NAN(fVar46))) {
    fVar44 = pIVar16->FontSize;
    fVar50 = fVar44 * 70.0;
    uVar41 = -(uint)(fVar50 <= tab_bar->ScrollingSpeed);
    fVar51 = ABS(fVar46 - fVar43) / 0.3;
    fVar50 = (float)(~uVar41 & (uint)fVar50 | (uint)tab_bar->ScrollingSpeed & uVar41);
    uVar41 = -(uint)(fVar51 <= fVar50);
    fVar51 = (float)(~uVar41 & (uint)fVar51 | uVar41 & (uint)fVar50);
    tab_bar->ScrollingSpeed = fVar51;
    fVar50 = fVar46;
    if ((pIVar16->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar44 * 10.0)) {
      fVar51 = fVar51 * (pIVar16->IO).DeltaTime;
      if (fVar46 <= fVar43) {
        fVar50 = fVar43;
        if (fVar46 < fVar43) {
          fVar43 = fVar43 - fVar51;
          uVar41 = -(uint)(fVar46 <= fVar43);
          fVar50 = (float)((uint)fVar43 & uVar41 | ~uVar41 & (uint)fVar46);
        }
      }
      else {
        fVar50 = fVar43 + fVar51;
        if (fVar46 <= fVar50) {
          fVar50 = fVar46;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar50;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = fVar53 + fVar45 + local_e8[1];
  tab_bar->ScrollingRectMaxX = (fVar42 - uStack_d0._4_4_) - fVar52;
  if ((tab_bar->Flags & 0x100000) == 0) {
    iVar33 = (tab_bar->TabsNames).Buf.Capacity;
    if (iVar33 < 0) {
      uVar41 = iVar33 / 2 + iVar33;
      size = 0;
      if (0 < (int)uVar41) {
        size = (size_t)uVar41;
      }
      __dest_00 = (char *)MemAlloc(size);
      __src = (tab_bar->TabsNames).Buf.Data;
      if (__src != (char *)0x0) {
        memcpy(__dest_00,__src,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_00;
      (tab_bar->TabsNames).Buf.Capacity = (int)size;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  (pIVar16->CurrentWindow->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabsIdeal;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = (prev_tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (prev_tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_track_selected_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_track_selected_tab_id = scroll_track_selected_tab->ID;
            if (!(scroll_track_selected_tab->Flags & ImGuiTabItemFlags_Button))
                tab_bar->SelectedTabId = scroll_track_selected_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabsIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
}